

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O3

uhugeint_t
duckdb::AddOperatorOverflowCheck::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t left,uhugeint_t right)

{
  uhugeint_t uVar1;
  bool bVar2;
  OutOfRangeException *this;
  PhysicalType type;
  uhugeint_t rhs;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  rhs.upper = right.upper;
  local_b0._M_string_length = left.upper;
  local_b0._M_dataplus._M_p = (pointer)left.lower;
  rhs.lower = rhs.upper;
  bVar2 = Uhugeint::TryAddInPlace((Uhugeint *)&local_b0,(uhugeint_t *)right.lower,rhs);
  if (bVar2) {
    uVar1.upper = local_b0._M_string_length;
    uVar1.lower = (uint64_t)local_b0._M_dataplus._M_p;
    return uVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Overflow in addition of %s (%s + %s)!","");
  TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xcb,type);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_70,left);
  NumericHelper::ToString<duckdb::uhugeint_t>(&local_90,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_b0,&local_50,&local_70,&local_90);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}